

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

bool __thiscall
andres::
BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
::isSimple(BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
           *this)

{
  CoordinateOrder CVar1;
  View<int,_false,_std::allocator<unsigned_long>_> *pVVar2;
  View<float,_false,_std::allocator<unsigned_long>_> *pVVar3;
  
  pVVar2 = this->e1_;
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar2);
  if (((pVVar2->geometry_).isSimple_ == true) &&
     (pVVar3 = this->e2_, View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar3),
     (pVVar3->geometry_).isSimple_ == true)) {
    pVVar2 = this->e1_;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar2);
    CVar1 = (pVVar2->geometry_).coordinateOrder_;
    pVVar3 = this->e2_;
    View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(pVVar3);
    return CVar1 == (pVVar3->geometry_).coordinateOrder_;
  }
  return false;
}

Assistant:

const bool isSimple() const
        { return e1_.isSimple() && e2_.isSimple() 
                 && e1_.coordinateOrder() == e2_.coordinateOrder(); }